

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzterm.c
# Opt level: O1

void fuzz_draw_cursor(TermWin *tw,wchar_t x,wchar_t y,wchar_t *text,wchar_t len,unsigned_long attr,
                     wchar_t lattr,truecolour tc)

{
  ulong uVar1;
  
  printf("CURS[attr=%08lx,lattr=%02x]@(%d,%d):",attr,(ulong)(uint)lattr,x,(ulong)(uint)y);
  if (L'\0' < len) {
    uVar1 = 0;
    do {
      printf(" %x",(ulong)(uint)text[uVar1]);
      uVar1 = uVar1 + 1;
    } while ((uint)len != uVar1);
  }
  putchar(10);
  return;
}

Assistant:

static void fuzz_draw_cursor(
    TermWin *tw, int x, int y, wchar_t *text, int len,
    unsigned long attr, int lattr, truecolour tc)
{
    int i;

    printf("CURS[attr=%08lx,lattr=%02x]@(%d,%d):", attr, lattr, x, y);
    for (i = 0; i < len; i++) {
        printf(" %x", (unsigned)text[i]);
    }
    printf("\n");
}